

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O0

size_t * get_delimiters_lengths(char **delimiters,size_t n_delims)

{
  LOGGER_LOG p_Var1;
  size_t sVar2;
  size_t local_60;
  size_t local_58;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t i;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t *result;
  size_t malloc_size;
  size_t n_delims_local;
  char **delimiters_local;
  
  if (n_delims == 0) {
    local_58 = 0;
  }
  else {
    if (n_delims < 0x2000000000000000) {
      local_60 = n_delims << 3;
    }
    else {
      local_60 = 0xffffffffffffffff;
    }
    local_58 = local_60;
  }
  if (local_58 == 0xffffffffffffffff) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_token.c"
                ,"get_delimiters_lengths",0x1e,1,"malloc size overflow");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(local_58);
    if (l == (LOGGER_LOG)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_token.c"
                  ,"get_delimiters_lengths",0x23,1,"Failed to allocate array for delimiters lengths"
                 );
      }
    }
    else {
      for (l_2 = (LOGGER_LOG)0x0; l_2 < n_delims; l_2 = l_2 + 1) {
        if (delimiters[(long)l_2] == (char *)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_token.c"
                      ,"get_delimiters_lengths",0x2d,1,"Invalid argument (delimiter %lu is NULL)",
                      l_2);
          }
          free(l);
          return (size_t *)0x0;
        }
        if (local_58 < (ulong)((long)(l_2 + 1) * 8)) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_token.c"
                      ,"get_delimiters_lengths",0x34,1,"buffer overflow");
          }
          free(l);
          return (size_t *)0x0;
        }
        sVar2 = strlen(delimiters[(long)l_2]);
        *(size_t *)(l + (long)l_2 * 8) = sVar2;
      }
    }
  }
  return (size_t *)l;
}

Assistant:

static size_t* get_delimiters_lengths(const char** delimiters, size_t n_delims)
{
    size_t malloc_size = safe_multiply_size_t(sizeof(size_t), n_delims);
    size_t* result;
    if (malloc_size == SIZE_MAX)
    {
        LogError("malloc size overflow");
        result = NULL;
    }
    else if ((result = malloc(malloc_size)) == NULL)
    {
        LogError("Failed to allocate array for delimiters lengths");
    }
    else
    {
        size_t i;
        for (i = 0; i < n_delims; i++)
        {
            if (delimiters[i] == NULL)
            {
                // Codes_SRS_STRING_TOKENIZER_09_002: [ If any of the strings in delimiters are NULL, the function shall return NULL ]
                LogError("Invalid argument (delimiter %lu is NULL)", (unsigned long)i);
                free(result);
                result = NULL;
                break;
            }
            else if (((i+1) * sizeof(size_t)) > malloc_size)
            {
                LogError("buffer overflow");
                free(result);
                result = NULL;
                break;
            }
            else 
            {
                result[i] = strlen(delimiters[i]);
            }
        }
    }

    return result;
}